

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void WriteDest(void)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  
  if ((long)WBLength != 0) {
    destlen = destlen + WBLength;
    if ((FP_Output != (FILE *)0x0) &&
       (sVar1 = fwrite(WriteBuffer,1,(long)WBLength,(FILE *)FP_Output), WBLength != (int)sVar1)) {
      Error("Write error (disk full?)",(char *)0x0,FATAL);
    }
    if ((FP_RAW != (FILE *)0x0) &&
       (sVar1 = fwrite(WriteBuffer,1,(long)WBLength,(FILE *)FP_RAW), WBLength != (int)sVar1)) {
      Error("Write error (disk full?)",(char *)0x0,FATAL);
    }
    if (FP_tapout != (FILE *)0x0) {
      iVar3 = 0xffff - tape_length;
      if (WBLength + tape_length < 0x10000) {
        iVar3 = WBLength;
      }
      sVar1 = fwrite(WriteBuffer,1,(long)iVar3,(FILE *)FP_tapout);
      if (iVar3 != (int)sVar1) {
        Error("Write error (disk full?)",(char *)0x0,FATAL);
      }
      if (0 < iVar3) {
        lVar2 = 0;
        do {
          tape_parity = tape_parity ^ WriteBuffer[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 < iVar3);
      }
      tape_length = tape_length + iVar3;
      if (iVar3 < WBLength) {
        WBLength = 0;
        CloseTapFile();
        Error("Tape block exceeds maximal size",(char *)0x0,PASS3);
      }
    }
    WBLength = 0;
  }
  return;
}

Assistant:

void WriteDest() {
	if (!WBLength) {
		return;
	}
	destlen += WBLength;
	if (FP_Output != NULL && (aint) fwrite(WriteBuffer, 1, WBLength, FP_Output) != WBLength) {
		Error("Write error (disk full?)", NULL, FATAL);
	}
	if (FP_RAW != NULL && (aint) fwrite(WriteBuffer, 1, WBLength, FP_RAW) != WBLength) {
		Error("Write error (disk full?)", NULL, FATAL);
	}

	if (FP_tapout)
	{
		int write_length = tape_length + WBLength > 65535 ? 65535 - tape_length : WBLength;

		if ( (aint)fwrite(WriteBuffer, 1, write_length, FP_tapout) != write_length) Error("Write error (disk full?)", NULL, FATAL);

		for (int i = 0; i < write_length; i++) tape_parity ^= WriteBuffer[i];
		tape_length += write_length;

		if (write_length < WBLength)
		{
			WBLength = 0;
			CloseTapFile();
			Error("Tape block exceeds maximal size");
		}
	}
	WBLength = 0;
}